

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O0

size_t __thiscall
MADPComponentDiscreteActions::GetNrJointActions(MADPComponentDiscreteActions *this)

{
  ostream *poVar1;
  E *this_00;
  undefined8 uVar2;
  long in_RDI;
  stringstream ss;
  stringstream *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe68;
  E *in_stack_fffffffffffffe70;
  ostream local_180 [384];
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe70);
    poVar1 = std::operator<<(local_180,"MADPComponentDiscreteActions::GetNrJointActions(");
    poVar1 = std::operator<<(poVar1,") - Error: not initialized. ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,in_stack_fffffffffffffe38);
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  if ((*(byte *)(in_RDI + 10) & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  return *(size_t *)(in_RDI + 0x10);
}

Assistant:

size_t MADPComponentDiscreteActions::GetNrJointActions() const
{
    if(!_m_initialized)
    {
        stringstream ss;
            ss << "MADPComponentDiscreteActions::GetNrJointActions("<< 
            ") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    if(!_m_jointIndicesValid)
    {
        throw(E("MADPComponentDiscreteActions::GetNrJointActions() joint indices are not available, overflow detected"));
    }
    return(_m_nrJointActions);
}